

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

void __thiscall QPDFParser::warn(QPDFParser *this,qpdf_offset_t offset,string *msg)

{
  int iVar1;
  undefined4 extraout_var;
  string local_120;
  string name;
  string local_e0;
  string descr;
  QPDFExc local_a0;
  
  if (this->stream_id == 0) {
    iVar1 = (*this->input->_vptr_InputSource[3])();
    QPDFExc::QPDFExc(&local_a0,qpdf_e_damaged_pdf,(string *)CONCAT44(extraout_var,iVar1),
                     this->object_description,offset,msg);
    warn(this,&local_a0);
    QPDFExc::~QPDFExc(&local_a0);
  }
  else {
    s_abi_cxx11_(&name,"object ",7);
    std::__cxx11::to_string(&local_120,this->obj_id);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                   &name,&local_120);
    std::operator+(&descr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_a0," 0");
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&name);
    QPDF::getFilename_abi_cxx11_(&local_120,this->context);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                   &local_120," object stream ");
    std::__cxx11::to_string(&local_e0,this->stream_id);
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_a0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_120);
    QPDFExc::QPDFExc(&local_a0,qpdf_e_damaged_pdf,&name,&descr,offset,msg);
    warn(this,&local_a0);
    QPDFExc::~QPDFExc(&local_a0);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&descr);
  }
  return;
}

Assistant:

void
QPDFParser::warn(qpdf_offset_t offset, std::string const& msg) const
{
    if (stream_id) {
        std::string descr = "object "s + std::to_string(obj_id) + " 0";
        std::string name = context->getFilename() + " object stream " + std::to_string(stream_id);
        warn(QPDFExc(qpdf_e_damaged_pdf, name, descr, offset, msg));
    } else {
        warn(QPDFExc(qpdf_e_damaged_pdf, input.getName(), object_description, offset, msg));
    }
}